

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint len;
  xmlChar *__dest;
  xmlChar *pxVar4;
  ulong uVar5;
  xmlChar *pxVar6;
  int l;
  xmlChar buf [105];
  int local_b4;
  xmlChar **local_b0;
  xmlChar local_a8 [120];
  
  pxVar6 = *str;
  iVar2 = xmlStringCurrentChar(ctxt,pxVar6,&local_b4);
  iVar3 = xmlIsNameStartChar(ctxt,iVar2);
  if (iVar3 == 0) {
LAB_0015d090:
    __dest = (xmlChar *)0x0;
  }
  else {
    if (local_b4 == 1) {
      local_a8[0] = (xmlChar)iVar2;
      len = 1;
    }
    else {
      len = xmlCopyCharMultiByte(local_a8,iVar2);
    }
    pxVar6 = pxVar6 + local_b4;
    iVar2 = xmlStringCurrentChar(ctxt,pxVar6,&local_b4);
    do {
      iVar3 = xmlIsNameChar(ctxt,iVar2);
      if (iVar3 == 0) {
        if (((int)len < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
          *str = pxVar6;
          pxVar6 = xmlStrndup(local_a8,len);
          return pxVar6;
        }
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
        goto LAB_0015d090;
      }
      if (local_b4 == 1) {
        local_a8[(int)len] = (xmlChar)iVar2;
        len = len + 1;
      }
      else {
        iVar2 = xmlCopyCharMultiByte(local_a8 + (int)len,iVar2);
        len = len + iVar2;
      }
      pxVar6 = pxVar6 + local_b4;
      iVar2 = xmlStringCurrentChar(ctxt,pxVar6,&local_b4);
    } while ((int)len < 100);
    uVar5 = (ulong)(len * 2);
    local_b0 = str;
    __dest = (xmlChar *)(*xmlMallocAtomic)(uVar5);
    if (__dest == (xmlChar *)0x0) {
      __dest = (xmlChar *)0x0;
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      memcpy(__dest,local_a8,(ulong)len);
      while (iVar3 = xmlIsNameChar(ctxt,iVar2), iVar3 != 0) {
        pxVar4 = __dest;
        if ((int)uVar5 < (int)(len + 10)) {
          if (((int)len < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
            uVar5 = (ulong)(uint)((int)uVar5 * 2);
            pxVar4 = (xmlChar *)(*xmlRealloc)(__dest,uVar5);
            if (pxVar4 == (xmlChar *)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              goto LAB_0015d00f;
            }
            bVar1 = true;
          }
          else {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
LAB_0015d00f:
            (*xmlFree)(__dest);
            bVar1 = false;
            pxVar4 = __dest;
          }
          if (!bVar1) goto LAB_0015d090;
        }
        if (local_b4 == 1) {
          pxVar4[(int)len] = (xmlChar)iVar2;
          len = len + 1;
        }
        else {
          iVar2 = xmlCopyCharMultiByte(pxVar4 + (int)len,iVar2);
          len = iVar2 + len;
        }
        pxVar6 = pxVar6 + local_b4;
        iVar2 = xmlStringCurrentChar(ctxt,pxVar6,&local_b4);
        __dest = pxVar4;
      }
      __dest[(int)len] = '\0';
      *local_b0 = pxVar6;
    }
  }
  return __dest;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;

#ifdef DEBUG
    nbParseStringName++;
#endif

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(l,buf,len,c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(l,buf,len,c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max * sizeof(xmlChar));
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;

                    if ((len > XML_MAX_NAME_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
			xmlFree(buffer);
                        return(NULL);
                    }
		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer,
			                            max * sizeof(xmlChar));
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if ((len > XML_MAX_NAME_LENGTH) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    return(xmlStrndup(buf, len));
}